

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O1

void fio_state_callback_force(callback_type_e c_type)

{
  callback_collection_s *pcVar1;
  fio_lock_i fVar2;
  long ****pppplVar3;
  ulong uVar4;
  fio_ls_embd_s *pfVar5;
  fio_ls_embd_s *pfVar6;
  fio_ls_embd_s *pfVar7;
  fio_defer_task_s task;
  long ***ppplVar8;
  long ****pppplVar9;
  int *piVar10;
  char *format;
  callback_data_s *tmp;
  fio_ls_embd_s *pfVar11;
  fio_lock_i ret;
  fio_ls_embd_s copy;
  timespec local_68;
  long ***local_58;
  long ***local_50;
  code *local_48;
  fio_ls_embd_s *pfStack_40;
  fio_ls_embd_s *local_38;
  
  if (c_type < (FIO_CALL_AT_EXIT|FIO_CALL_BEFORE_FORK)) {
    uVar4 = (ulong)c_type;
    pcVar1 = callback_collection + uVar4;
    LOCK();
    fVar2 = pcVar1->lock;
    pcVar1->lock = '\x01';
    UNLOCK();
    local_68.tv_sec = CONCAT71(local_68.tv_sec._1_7_,fVar2);
    local_58 = (long ***)&local_58;
    local_50 = (long ***)&local_58;
    if (fVar2 != '\0') {
      do {
        local_68.tv_sec = 0;
        local_68.tv_nsec = 1;
        nanosleep(&local_68,(timespec *)0x0);
        LOCK();
        fVar2 = pcVar1->lock;
        pcVar1->lock = '\x01';
        UNLOCK();
        local_68.tv_sec = CONCAT71(local_68.tv_sec._1_7_,fVar2);
      } while (fVar2 != '\0');
    }
    if (callback_collection[uVar4].callbacks.next == (fio_ls_embd_s *)0x0) {
      pfVar11 = (fio_ls_embd_s *)(uVar4 * 0x18 + 0x18b9e8);
      callback_collection[uVar4].callbacks.prev = pfVar11;
      callback_collection[uVar4].callbacks.next = pfVar11;
    }
    if (c_type < FIO_CALL_ON_IDLE) {
      for (pfVar11 = callback_collection[uVar4].callbacks.next;
          pfVar11 != &callback_collection[uVar4].callbacks; pfVar11 = pfVar11->next) {
        ppplVar8 = (long ***)fio_malloc(0x20);
        if (ppplVar8 == (long ***)0x0) {
          if (0 < FIO_LOG_LEVEL) {
            format = 
            "FATAL: memory allocation error /workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fio.c:3379"
            ;
LAB_0012d80a:
            FIO_LOG2STDERR(format);
          }
LAB_0012d811:
          kill(0,2);
          piVar10 = __errno_location();
          exit(*piVar10);
        }
        pfVar5 = pfVar11->prev;
        pfVar6 = pfVar11->next;
        pfVar7 = pfVar11[1].next;
        ppplVar8[2] = (long **)pfVar11[1].prev;
        ppplVar8[3] = (long **)pfVar7;
        *ppplVar8 = (long **)pfVar5;
        ppplVar8[1] = (long **)pfVar6;
        if ((long ****)local_50 != (long ****)0x0) {
          *ppplVar8 = *local_50;
          ppplVar8[1] = (long **)local_50;
          (*local_50)[1] = (long *)ppplVar8;
          *local_50 = (long **)ppplVar8;
        }
      }
    }
    else if (c_type == FIO_CALL_ON_IDLE) {
      for (pfVar11 = callback_collection[uVar4].callbacks.next;
          pfVar11 != (fio_ls_embd_s *)(uVar4 * 0x18 + 0x18b9e8); pfVar11 = pfVar11->next) {
        local_48 = fio_state_on_idle_perform;
        pfStack_40 = pfVar11[1].prev;
        local_38 = pfVar11[1].next;
        task.arg1 = pfStack_40;
        task.func = fio_state_on_idle_perform;
        task.arg2 = local_38;
        fio_defer_push_task_fn(task,&task_queue_normal);
      }
    }
    else {
      for (pfVar11 = callback_collection[uVar4].callbacks.next;
          pfVar11 != &callback_collection[uVar4].callbacks; pfVar11 = pfVar11->next) {
        pppplVar9 = (long ****)fio_malloc(0x20);
        if (pppplVar9 == (long ****)0x0) {
          if (FIO_LOG_LEVEL < 1) goto LAB_0012d811;
          format = 
          "FATAL: memory allocation error /workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fio.c:3402"
          ;
          goto LAB_0012d80a;
        }
        pfVar5 = pfVar11->prev;
        pfVar6 = pfVar11->next;
        pfVar7 = pfVar11[1].next;
        pppplVar9[2] = (long ***)pfVar11[1].prev;
        pppplVar9[3] = (long ***)pfVar7;
        *pppplVar9 = (long ***)pfVar5;
        pppplVar9[1] = (long ***)pfVar6;
        *pppplVar9 = local_58;
        pppplVar9[1] = (long ***)&local_58;
        local_58[1] = (long **)pppplVar9;
        local_58 = (long ***)pppplVar9;
      }
    }
    LOCK();
    fVar2 = pcVar1->lock;
    pcVar1->lock = '\0';
    UNLOCK();
    local_68.tv_sec = CONCAT71(local_68.tv_sec._1_7_,fVar2);
    while (pppplVar9 = (long ****)local_58, (long ****)local_50 != &local_58) {
      pppplVar3 = (long ****)local_58[1];
      if (pppplVar3 == (long ****)local_58 || pppplVar3 == (long ****)0x0) {
        pppplVar9 = (long ****)0x0;
      }
      else {
        *pppplVar3 = (long ***)*local_58;
        (*local_58)[1] = (long *)pppplVar3;
        local_58[1] = (long **)local_58;
        *local_58 = (long **)local_58;
      }
      if (pppplVar9[2] != (long ***)0x0) {
        (*(code *)pppplVar9[2])(pppplVar9[3]);
      }
      fio_free(pppplVar9);
    }
  }
  return;
}

Assistant:

void fio_state_callback_force(callback_type_e c_type) {
  if ((int)c_type < 0 || c_type > FIO_CALL_NEVER)
    return;
  /* copy collection */
  fio_ls_embd_s copy = FIO_LS_INIT(copy);
  fio_lock(&callback_collection[c_type].lock);
  fio_state_callback_ensure(&callback_collection[c_type]);
  switch (c_type) {            /* the difference between `unshift` and `push` */
  case FIO_CALL_ON_INITIALIZE: /* fallthrough */
  case FIO_CALL_PRE_START:     /* fallthrough */
  case FIO_CALL_BEFORE_FORK:   /* fallthrough */
  case FIO_CALL_AFTER_FORK:    /* fallthrough */
  case FIO_CALL_IN_CHILD:      /* fallthrough */
  case FIO_CALL_IN_MASTER:     /* fallthrough */
  case FIO_CALL_ON_START:      /* fallthrough */
    FIO_LS_EMBD_FOR(&callback_collection[c_type].callbacks, pos) {
      callback_data_s *tmp = fio_malloc(sizeof(*tmp));
      FIO_ASSERT_ALLOC(tmp);
      *tmp = *(FIO_LS_EMBD_OBJ(callback_data_s, node, pos));
      fio_ls_embd_unshift(&copy, &tmp->node);
    }
    break;

  case FIO_CALL_ON_IDLE: /* idle callbacks are orderless and evented */
    FIO_LS_EMBD_FOR(&callback_collection[c_type].callbacks, pos) {
      callback_data_s *tmp = FIO_LS_EMBD_OBJ(callback_data_s, node, pos);
      fio_defer_push_task(fio_state_on_idle_perform,
                          (void *)(uintptr_t)tmp->func, tmp->arg);
    }
    break;

  case FIO_CALL_ON_SHUTDOWN:     /* fallthrough */
  case FIO_CALL_ON_FINISH:       /* fallthrough */
  case FIO_CALL_ON_PARENT_CRUSH: /* fallthrough */
  case FIO_CALL_ON_CHILD_CRUSH:  /* fallthrough */
  case FIO_CALL_AT_EXIT:         /* fallthrough */
  case FIO_CALL_NEVER:           /* fallthrough */
  default:
    FIO_LS_EMBD_FOR(&callback_collection[c_type].callbacks, pos) {
      callback_data_s *tmp = fio_malloc(sizeof(*tmp));
      FIO_ASSERT_ALLOC(tmp);
      *tmp = *(FIO_LS_EMBD_OBJ(callback_data_s, node, pos));
      fio_ls_embd_push(&copy, &tmp->node);
    }
    break;
  }

  fio_unlock(&callback_collection[c_type].lock);
  /* run callbacks + free data */
  while (fio_ls_embd_any(&copy)) {
    callback_data_s *tmp =
        FIO_LS_EMBD_OBJ(callback_data_s, node, fio_ls_embd_pop(&copy));
    if (tmp->func) {
      tmp->func(tmp->arg);
    }
    fio_free(tmp);
  }
}